

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::~QLayout(QLayout *this)

{
  bool bVar1;
  QLayoutPrivate *this_00;
  QObject *pQVar2;
  QWidgetPrivate *pQVar3;
  QLayout *pQVar4;
  QLayout *in_RDI;
  QLayout *parentLayout;
  QLayoutPrivate *d;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00d07730;
  (in_RDI->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QLayout_00d07830;
  this_00 = d_func((QLayout *)0x33e37b);
  if (((this_00->field_0x8c & 1) != 0) &&
     (pQVar2 = QObject::parent((QObject *)0x33e39f), pQVar2 != (QObject *)0x0)) {
    QObject::parent((QObject *)0x33e3af);
    bVar1 = QObject::isWidgetType((QObject *)0x33e3b7);
    if (bVar1) {
      parentWidget((QLayout *)this_00);
      pQVar4 = QWidget::layout((QWidget *)0x33e3cf);
      if (pQVar4 == in_RDI) {
        parentWidget((QLayout *)this_00);
        pQVar3 = QWidget::d_func((QWidget *)0x33e3eb);
        pQVar3->layout = (QLayout *)0x0;
        goto LAB_0033e42c;
      }
    }
  }
  QObject::parent((QObject *)0x33e402);
  pQVar4 = qobject_cast<QLayout*>((QObject *)0x33e40a);
  if (pQVar4 != (QLayout *)0x0) {
    removeItem((QLayout *)this_00,(QLayoutItem *)pQVar4);
  }
LAB_0033e42c:
  QLayoutItem::~QLayoutItem(&in_RDI->super_QLayoutItem);
  QObject::~QObject(&in_RDI->super_QObject);
  return;
}

Assistant:

QLayout::~QLayout()
{
    Q_D(QLayout);
    if (d->topLevel && parent() && parent()->isWidgetType() && parentWidget()->layout() == this)
        parentWidget()->d_func()->layout = nullptr;
    else if (QLayout *parentLayout = qobject_cast<QLayout *>(parent()))
        parentLayout->removeItem(this);
}